

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

int __thiscall amrex::ParmParse::remove(ParmParse *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  iterator __position;
  _List_node_base *p_Var3;
  allocator local_79;
  char *local_78;
  string local_70;
  string local_50;
  
  __position._M_node =
       (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
        &((_List_node_base *)this->m_table)->_M_next)->_M_impl)._M_node.super__List_node_base.
       _M_next;
  if (__position._M_node == (_List_node_base *)this->m_table) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    local_78 = __filename;
    do {
      std::__cxx11::string::string((string *)&local_70,local_78,&local_79);
      prefixedName(&local_50,this,&local_70);
      bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(__position._M_node + 1),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        p_Var3 = (__position._M_node)->_M_next;
        std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
        ::_M_erase(this->m_table,__position);
        iVar2 = iVar2 + 1;
      }
      else {
        p_Var3 = (__position._M_node)->_M_next;
      }
      __position._M_node = p_Var3;
    } while (p_Var3 != (_List_node_base *)this->m_table);
  }
  return iVar2;
}

Assistant:

int
ParmParse::remove (const char* name)
{
    int r = 0;
    for (auto it = m_table.begin(); it != m_table.end(); ) {
        if (ppfound(prefixedName(name), *it, false)) {
            it = m_table.erase(it);
            ++r;
        } else {
            ++it;
        }
    }
    return r;
}